

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

bool booster::regex_search<booster::regex>(char *s,cmatch *m,regex *r,int flags)

{
  byte bVar1;
  size_t sVar2;
  char *in_RDX;
  char *in_RDI;
  bool res;
  char *end;
  char *begin;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> map;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff78;
  char *end_00;
  char *begin_00;
  undefined7 in_stack_ffffffffffffff90;
  char local_40 [32];
  char *local_20;
  char *local_10;
  byte local_1;
  
  end_00 = local_40;
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x114119);
  begin_00 = local_10;
  sVar2 = strlen(local_10);
  bVar1 = booster::regex::search(local_20,local_10,(vector *)(begin_00 + sVar2),(int)end_00);
  local_1 = (bVar1 & 1) != 0;
  if ((bool)local_1) {
    match_results<const_char_*>::assign
              ((match_results<const_char_*> *)CONCAT17(bVar1,in_stack_ffffffffffffff90),begin_00,
               end_00,in_stack_ffffffffffffff78);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff90));
  return (bool)(local_1 & 1);
}

Assistant:

bool regex_search(char const *s,cmatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		char const *begin=s;
		char const *end = begin+strlen(begin);
		bool res = r.search(begin,end,map,flags);
		if(!res) return false;
		m.assign(begin,end,map);
		return true;
	}